

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.h
# Opt level: O0

void __thiscall HighsDomain::setupObjectivePropagation(HighsDomain *this)

{
  ObjectivePropagation *in_RDI;
  HighsDomain *in_stack_00000068;
  ObjectivePropagation *in_stack_00000070;
  ObjectivePropagation *in_stack_ffffffffffffff48;
  
  ObjectivePropagation::ObjectivePropagation(in_stack_00000070,in_stack_00000068);
  ObjectivePropagation::operator=(in_RDI,in_stack_ffffffffffffff48);
  ObjectivePropagation::~ObjectivePropagation(in_RDI);
  return;
}

Assistant:

void setupObjectivePropagation() { objProp_ = ObjectivePropagation(this); }